

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSaveFileButton.cpp
# Opt level: O0

void QSaveFileButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  Int *pIVar2;
  Options OVar3;
  QList<QString> *this;
  QSaveFileButton *this_00;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  void *_v_1;
  QSaveFileButton *_t_2;
  void *_v;
  QSaveFileButton *_t_1;
  int *result;
  QSaveFileButton *_t;
  QSaveFileButton *in_stack_ffffffffffffff38;
  QSaveFileButton *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QSaveFileButton *in_stack_ffffffffffffff50;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      filePathChanged(in_stack_ffffffffffffff50,
                      (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
  }
  else if (in_ESI == 5) {
    pcVar1 = *(code **)in_RCX[1];
    if (pcVar1 == filePathChanged && (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *(undefined4 *)*in_RCX = 0;
    }
  }
  else if (in_ESI == 1) {
    pIVar2 = (Int *)*in_RCX;
    this = (QList<QString> *)(ulong)in_EDX;
    switch(this) {
    case (QList<QString> *)0x0:
      filePath(in_stack_ffffffffffffff38);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x1d7d75);
      break;
    case (QList<QString> *)0x1:
      caption(in_stack_ffffffffffffff38);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x1d7da8);
      break;
    case (QList<QString> *)0x2:
      directory(in_stack_ffffffffffffff38);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x1d7ddb);
      break;
    case (QList<QString> *)0x3:
      filter(in_stack_ffffffffffffff38);
      QList<QString>::operator=(this,(QList<QString> *)in_stack_ffffffffffffff38);
      QList<QString>::~QList((QList<QString> *)0x1d7e0b);
      break;
    case (QList<QString> *)0x4:
      OVar3 = options(in_stack_ffffffffffffff38);
      *pIVar2 = OVar3.i;
    }
  }
  else if (in_ESI == 2) {
    this_00 = (QSaveFileButton *)(ulong)in_EDX;
    switch(this_00) {
    case (QSaveFileButton *)0x0:
      setFilePath(in_stack_ffffffffffffff40,(QString *)this_00);
      break;
    case (QSaveFileButton *)0x1:
      setCaption(in_stack_ffffffffffffff40,(QString *)this_00);
      break;
    case (QSaveFileButton *)0x2:
      setDirectory(in_stack_ffffffffffffff40,(QString *)this_00);
      break;
    case (QSaveFileButton *)0x3:
      setFilter(in_stack_ffffffffffffff40,(QStringList *)this_00);
      break;
    case (QSaveFileButton *)0x4:
      setOptions(this_00,(Options)(Int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    }
  }
  return;
}

Assistant:

void QSaveFileButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QSaveFileButton::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSaveFileButton::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 3: *reinterpret_cast< QStringList*>(_v) = _t->filter(); break;
        case 4: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setFilter(*reinterpret_cast< QStringList*>(_v)); break;
        case 4: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}